

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O0

RGBA __thiscall glcts::DrawBuffersIndexedBlending::GetEpsilon(DrawBuffersIndexedBlending *this)

{
  uint g;
  uint b;
  code *pcVar1;
  int iVar2;
  uint uVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  int *piVar5;
  uint *puVar6;
  double dVar7;
  int local_44;
  undefined1 local_40 [4];
  int i;
  UVec4 epsilon;
  IVec4 bits;
  Functions *gl;
  DrawBuffersIndexedBlending *this_local;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(epsilon.m_data + 2));
  tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)local_40);
  for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
    pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x868);
    piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(epsilon.m_data + 2),local_44);
    (*pcVar1)(local_44 + 0xd52,piVar5);
    piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(epsilon.m_data + 2),local_44);
    dVar7 = pow(2.0,(double)*piVar5);
    dVar7 = ceil((1.0 / dVar7) * 255.0 + 1.0);
    uVar3 = de::min<unsigned_int>(0xff,(uint)(long)dVar7);
    puVar6 = tcu::Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_40,local_44);
    *puVar6 = uVar3;
  }
  puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_40);
  uVar3 = *puVar6;
  puVar6 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)local_40);
  g = *puVar6;
  puVar6 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)local_40);
  b = *puVar6;
  puVar6 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)local_40);
  tcu::RGBA::RGBA((RGBA *)((long)&this_local + 4),uVar3,g,b,*puVar6);
  return (RGBA)this_local._4_4_;
}

Assistant:

tcu::RGBA DrawBuffersIndexedBlending::GetEpsilon()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	tcu::IVec4 bits;
	tcu::UVec4 epsilon;

	for (int i = 0; i < 4; ++i)
	{
		gl.getIntegerv(GL_RED_BITS + i, &bits[i]);
		epsilon[i] = de::min(
			255u, static_cast<unsigned int>(ceil(1.0 + 255.0 * (1.0 / pow(2.0, static_cast<double>(bits[i]))))));
	}

	return tcu::RGBA(epsilon.x(), epsilon.y(), epsilon.z(), epsilon.w());
}